

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeGravityForces
          (ChElementShellANCF_3423 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  double dVar1;
  undefined1 (*pauVar2) [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  auVar8 = _DAT_009aabc0;
  auVar7 = _DAT_009aab80;
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x18)
  {
    auVar6 = *(undefined1 (*) [64])
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
              m_storage.m_data.array;
    pauVar2 = (undefined1 (*) [64])
              (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar1 = G_acc->m_data[0];
    auVar3._8_8_ = dVar1;
    auVar3._0_8_ = dVar1;
    auVar3._16_8_ = dVar1;
    auVar3._24_8_ = dVar1;
    auVar3._32_8_ = dVar1;
    auVar3._40_8_ = dVar1;
    auVar3._48_8_ = dVar1;
    auVar3._56_8_ = dVar1;
    auVar3 = vmulpd_avx512f(auVar6,auVar3);
    dVar1 = G_acc->m_data[1];
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar4._16_8_ = dVar1;
    auVar4._24_8_ = dVar1;
    auVar4._32_8_ = dVar1;
    auVar4._40_8_ = dVar1;
    auVar4._48_8_ = dVar1;
    auVar4._56_8_ = dVar1;
    auVar4 = vmulpd_avx512f(auVar6,auVar4);
    dVar1 = G_acc->m_data[2];
    auVar5._8_8_ = dVar1;
    auVar5._0_8_ = dVar1;
    auVar5._16_8_ = dVar1;
    auVar5._24_8_ = dVar1;
    auVar5._32_8_ = dVar1;
    auVar5._40_8_ = dVar1;
    auVar5._48_8_ = dVar1;
    auVar5._56_8_ = dVar1;
    auVar5 = vmulpd_avx512f(auVar6,auVar5);
    auVar6 = vpermi2pd_avx512f(_DAT_009aab00,auVar3,auVar4);
    auVar6 = vpermi2pd_avx512f(_DAT_009aab40,auVar6,auVar5);
    *pauVar2 = auVar6;
    auVar6 = _DAT_009aac40;
    auVar7 = vpermi2pd_avx512f(auVar7,auVar5,auVar3);
    auVar7 = vpermi2pd_avx512f(auVar8,auVar7,auVar4);
    auVar8 = vpermi2pd_avx512f(_DAT_009aac00,auVar4,auVar5);
    pauVar2[1] = auVar7;
    auVar7 = vpermi2pd_avx512f(auVar6,auVar8,auVar3);
    pauVar2[2] = auVar7;
    return;
  }
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3423.cpp"
                ,0x114,
                "virtual void chrono::fea::ChElementShellANCF_3423::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementShellANCF_3423::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}